

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScene::render
          (QGraphicsScene *this,QPainter *painter,QRectF *target,QRectF *source,
          AspectRatioMode aspectRatioMode)

{
  undefined8 uVar1;
  QGraphicsItemPrivate *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  double dVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  qsizetype qVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  void *pvVar12;
  undefined8 *puVar13;
  QTransform *pQVar14;
  QStyleOptionGraphicsItem *pQVar15;
  long lVar16;
  undefined1 *puVar17;
  ulong uVar18;
  QStyleOptionGraphicsItem *pQVar19;
  qreal *pqVar20;
  QRect *pQVar21;
  qsizetype i;
  long lVar22;
  long in_FS_OFFSET;
  byte bVar23;
  undefined4 uVar24;
  double dVar25;
  double dVar26;
  undefined8 uVar28;
  undefined1 auVar27 [16];
  double dVar29;
  QTransform painterTransform;
  undefined1 local_178 [16];
  QRegion local_140;
  QList<QGraphicsItem_*> local_138;
  double local_118;
  qreal qStack_110;
  double local_108;
  double dStack_100;
  QRectF local_f8;
  QRect local_d8 [4];
  ushort local_90;
  QTransform local_88;
  long local_38;
  
  bVar23 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8.xp = source->xp;
  local_f8.yp = source->yp;
  local_f8.w = source->w;
  local_f8.h = source->h;
  if ((((local_f8.w == 0.0) && (!NAN(local_f8.w))) && (local_f8.h == 0.0)) && (!NAN(local_f8.h))) {
    sceneRect(&local_f8,this);
  }
  uVar28 = 0;
  local_118 = target->xp;
  qStack_110 = target->yp;
  local_108 = target->w;
  dStack_100 = target->h;
  if (((local_108 == 0.0) && (!NAN(local_108))) && ((dStack_100 == 0.0 && (!NAN(dStack_100))))) {
    uVar28 = 0;
    plVar11 = (long *)QPainter::device();
    iVar9 = (**(code **)(*plVar11 + 0x10))(plVar11);
    if (iVar9 == 5) {
      local_108 = local_f8.w;
      dStack_100 = local_f8.h;
      local_118 = local_f8.xp;
      qStack_110 = local_f8.yp;
    }
    else {
      plVar11 = (long *)QPainter::device();
      iVar9 = (**(code **)(*plVar11 + 0x20))(plVar11,1);
      plVar11 = (long *)QPainter::device();
      iVar10 = (**(code **)(*plVar11 + 0x20))(plVar11,2);
      dStack_100 = (double)iVar10;
      local_118 = 0.0;
      qStack_110 = 0.0;
      local_108 = (double)iVar9;
    }
  }
  auVar6._8_8_ = dStack_100;
  auVar6._0_8_ = local_108;
  auVar7._8_8_ = local_f8.h;
  auVar7._0_8_ = local_f8.w;
  local_178 = divpd(auVar6,auVar7);
  dVar25 = local_178._8_8_;
  dVar29 = local_178._0_8_;
  if (aspectRatioMode == KeepAspectRatioByExpanding) {
    uVar24 = local_178._8_4_;
    if (dVar25 <= dVar29) {
      uVar24 = local_178._0_4_;
      local_178._12_4_ = local_178._4_4_;
    }
    local_178._4_4_ = local_178._12_4_;
    local_178._0_4_ = uVar24;
    local_178._8_4_ = uVar24;
  }
  else if (aspectRatioMode == KeepAspectRatio) {
    if (dVar25 <= dVar29) {
      dVar29 = dVar25;
    }
    local_178._8_8_ = dVar29;
    local_178._0_8_ = dVar29;
  }
  local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.d._0_4_ = 0xaaaaaaaa;
  local_138.d.d._4_4_ = 0xaaaaaaaa;
  local_138.d.ptr._0_4_ = 0xaaaaaaaa;
  local_138.d.ptr._4_4_ = 0xaaaaaaaa;
  pqVar20 = (qreal *)&DAT_00702c10;
  pQVar14 = &local_88;
  for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
    pQVar14->m_matrix[0][0] = *pqVar20;
    pqVar20 = pqVar20 + (ulong)bVar23 * -2 + 1;
    pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar23 * -2 + 1) * 8);
  }
  local_88._72_2_ = local_88._72_2_ & 0xfc00;
  (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x70))
            (&local_138,*(long **)(*(long *)(this + 8) + 0x88),&local_f8,3,1);
  qVar8 = local_138.d.size;
  pvVar12 = operator_new__(local_138.d.size * 8);
  if ((undefined1 *)qVar8 != (undefined1 *)0x0) {
    puVar13 = (undefined8 *)CONCAT44(local_138.d.ptr._4_4_,local_138.d.ptr._0_4_);
    puVar17 = (undefined1 *)qVar8;
    do {
      *(undefined8 *)((long)pvVar12 + (long)puVar17 * 8 + -8) = *puVar13;
      puVar13 = puVar13 + 1;
      puVar17 = puVar17 + -1;
    } while (puVar17 != (undefined1 *)0x0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = qVar8;
  uVar18 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x60),8) == 0) {
    uVar18 = SUB168(auVar2 * ZEXT816(0x60),0) | 8;
  }
  QList<QGraphicsItem_*>::clear(&local_138);
  QPainter::save();
  QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_118);
  pqVar20 = (qreal *)&DAT_00702c58;
  pQVar14 = &local_88;
  for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
    pQVar14->m_matrix[0][0] = *pqVar20;
    pqVar20 = pqVar20 + (ulong)bVar23 * -2 + 1;
    pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar23 * -2 + 1) * 8);
  }
  pqVar20 = (qreal *)&DAT_00702c10;
  pQVar14 = &local_88;
  for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
    pQVar14->m_matrix[0][0] = *pqVar20;
    pqVar20 = pqVar20 + (ulong)bVar23 * -2 + 1;
    pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar23 * -2 + 1) * 8);
  }
  local_88._72_2_ = local_88._72_2_ & 0xfc00;
  puVar13 = &DAT_00702c10;
  pQVar21 = local_d8;
  for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
    uVar1 = *puVar13;
    pQVar21->x1 = (Representation)(int)uVar1;
    pQVar21->y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
    puVar13 = puVar13 + (ulong)bVar23 * -2 + 1;
    pQVar21 = (QRect *)&pQVar21[-(ulong)bVar23].x2;
  }
  auVar3._4_8_ = uVar28;
  auVar3._0_4_ = local_178._4_4_;
  auVar27._0_8_ = auVar3._0_8_ << 0x20;
  auVar27._8_4_ = local_178._8_4_;
  auVar27._12_4_ = local_178._12_4_;
  local_90 = local_90 & 0xfc00;
  QTransform::translate(local_118,qStack_110);
  QTransform::scale((double)local_178._0_8_,auVar27._8_8_);
  pQVar14 = (QTransform *)QTransform::translate(-local_f8.xp,-local_f8.yp);
  QTransform::operator*=(&local_88,pQVar14);
  QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_88,0));
  plVar11 = (long *)operator_new__(uVar18);
  *plVar11 = qVar8;
  pQVar15 = (QStyleOptionGraphicsItem *)(plVar11 + 1);
  if ((undefined1 *)qVar8 != (undefined1 *)0x0) {
    lVar16 = qVar8 * 0x60;
    pQVar19 = pQVar15;
    do {
      QStyleOptionGraphicsItem::QStyleOptionGraphicsItem(pQVar19);
      pQVar19 = pQVar19 + 1;
      lVar16 = lVar16 + -0x60;
    } while (lVar16 != 0);
    puVar17 = (undefined1 *)0x0;
    pQVar19 = pQVar15;
    do {
      dVar25 = (double)((ulong)local_118 & 0x8000000000000000 | 0x3fe0000000000000) + local_118;
      dVar29 = 2147483647.0;
      if (dVar25 <= 2147483647.0) {
        dVar29 = dVar25;
      }
      if (dVar29 <= -2147483648.0) {
        dVar29 = -2147483648.0;
      }
      local_d8[0].x1.m_i = (int)dVar29;
      dVar26 = (double)((ulong)qStack_110 & 0x8000000000000000 | 0x3fe0000000000000) + qStack_110;
      dVar25 = 2147483647.0;
      if (dVar26 <= 2147483647.0) {
        dVar25 = dVar26;
      }
      if (dVar25 <= -2147483648.0) {
        dVar25 = -2147483648.0;
      }
      dVar26 = (local_118 - (double)(int)dVar29) * 0.5 + local_108;
      dVar26 = (double)((ulong)dVar26 & 0x8000000000000000 | 0x3fe0000000000000) + dVar26;
      dVar29 = 2147483647.0;
      if (dVar26 <= 2147483647.0) {
        dVar29 = dVar26;
      }
      if (dVar29 <= -2147483648.0) {
        dVar29 = -2147483648.0;
      }
      this_00 = *(QGraphicsItemPrivate **)(*(long *)((long)pvVar12 + (long)puVar17 * 8) + 8);
      dVar26 = (qStack_110 - (double)(int)dVar25) * 0.5 + dStack_100;
      dVar26 = (double)((ulong)dVar26 & 0x8000000000000000 | 0x3fe0000000000000) + dVar26;
      dVar4 = 2147483647.0;
      if (dVar26 <= 2147483647.0) {
        dVar4 = dVar26;
      }
      if (dVar4 <= -2147483648.0) {
        dVar4 = -2147483648.0;
      }
      local_d8[0].x2.m_i = (int)dVar29 + local_d8[0].x1.m_i + -1;
      local_d8[0].y1.m_i = (int)dVar25;
      local_d8[0].y2.m_i = (int)dVar4 + (int)dVar25 + -1;
      QRegion::QRegion(&local_140,local_d8,Rectangle);
      QGraphicsItemPrivate::initStyleOption(this_00,pQVar19,&local_88,&local_140,false);
      QRegion::~QRegion(&local_140);
      puVar17 = puVar17 + 1;
      pQVar19 = pQVar19 + 1;
    } while ((undefined1 *)qVar8 != puVar17);
  }
  (**(code **)(*(long *)this + 0xe8))(this,painter,&local_f8);
  (**(code **)(*(long *)this + 0xf8))(this,painter,qVar8 & 0xffffffff,pvVar12,pQVar15,0);
  (**(code **)(*(long *)this + 0xf0))(this,painter,&local_f8);
  operator_delete__(pvVar12);
  lVar16 = *plVar11;
  if (lVar16 != 0) {
    lVar22 = lVar16 * 0x60;
    do {
      QStyleOption::~QStyleOption((QStyleOption *)((long)plVar11 + lVar22 + -0x58));
      lVar22 = lVar22 + -0x60;
    } while (lVar22 != 0);
  }
  operator_delete__(plVar11,lVar16 * 0x60 + 8);
  QPainter::restore();
  piVar5 = (int *)CONCAT44(local_138.d.d._4_4_,local_138.d.d._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_138.d.d._4_4_,local_138.d.d._0_4_),8,0x10)
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::render(QPainter *painter, const QRectF &target, const QRectF &source,
                            Qt::AspectRatioMode aspectRatioMode)
{
    // ### Switch to using the recursive rendering algorithm instead.

    // Default source rect = scene rect
    QRectF sourceRect = source;
    if (sourceRect.isNull())
        sourceRect = sceneRect();

    // Default target rect = device rect
    QRectF targetRect = target;
    if (targetRect.isNull()) {
        if (painter->device()->devType() == QInternal::Picture)
            targetRect = sourceRect;
        else
            targetRect.setRect(0, 0, painter->device()->width(), painter->device()->height());
    }

    // Find the ideal x / y scaling ratio to fit \a source into \a target.
    qreal xratio = targetRect.width() / sourceRect.width();
    qreal yratio = targetRect.height() / sourceRect.height();

    // Scale according to the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Find all items to draw, and reverse the list (we want to draw
    // in reverse order).
    QList<QGraphicsItem *> itemList = items(sourceRect, Qt::IntersectsItemBoundingRect);
    QGraphicsItem **itemArray = new QGraphicsItem *[itemList.size()];
    const qsizetype numItems = itemList.size();
    for (qsizetype i = 0; i < numItems; ++i)
        itemArray[numItems - i - 1] = itemList.at(i);
    itemList.clear();

    painter->save();

    // Transform the painter.
    painter->setClipRect(targetRect, Qt::IntersectClip);
    QTransform painterTransform;
    painterTransform *= QTransform()
                        .translate(targetRect.left(), targetRect.top())
                        .scale(xratio, yratio)
                        .translate(-sourceRect.left(), -sourceRect.top());
    painter->setWorldTransform(painterTransform, true);

    // Generate the style options
    QStyleOptionGraphicsItem *styleOptionArray = new QStyleOptionGraphicsItem[numItems];
    for (qsizetype i = 0; i < numItems; ++i)
        itemArray[i]->d_ptr->initStyleOption(&styleOptionArray[i], painterTransform, targetRect.toRect());

    // Render the scene.
    drawBackground(painter, sourceRect);
    drawItems(painter, numItems, itemArray, styleOptionArray);
    drawForeground(painter, sourceRect);

    delete [] itemArray;
    delete [] styleOptionArray;

    painter->restore();
}